

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O3

exr_result_t
exr_attr_get_string_vector
          (exr_const_context_t_conflict ctxt,int part_index,char *name,int32_t *size,char **out)

{
  uint uVar1;
  exr_result_t eVar2;
  exr_attr_chlist_t *peVar3;
  long lVar4;
  exr_context_t nonc;
  long lVar5;
  uint uVar6;
  exr_attribute_t *attr;
  exr_attribute_t *local_30;
  
  if (ctxt == (exr_const_context_t_conflict)0x0) {
    return 2;
  }
  if (ctxt->mode == '\x01') {
    pthread_mutex_lock((pthread_mutex_t *)&ctxt->mutex);
  }
  if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
    if (ctxt->mode == '\x01') {
      pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
    }
    eVar2 = (*ctxt->print_error)
                      (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                       ctxt->print_error);
    return eVar2;
  }
  if ((name == (char *)0x0) || (*name == '\0')) {
    if (ctxt->mode == '\x01') {
      pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
    }
    eVar2 = (*ctxt->report_error)(ctxt,3,"Invalid name for stringvector attribute query");
    return eVar2;
  }
  eVar2 = exr_attr_list_find_by_name(ctxt,&ctxt->parts[(uint)part_index]->attributes,name,&local_30)
  ;
  if (eVar2 == 0) {
    if (local_30->type != EXR_ATTR_STRING_VECTOR) {
      if (ctxt->mode == '\x01') {
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
      }
      eVar2 = (*ctxt->print_error)
                        (ctxt,0x10,
                         "\'%s\' requested type \'stringvector\', but stored attributes is type \'%s\'"
                         ,name,local_30->type_name);
      return eVar2;
    }
    if (size == (int32_t *)0x0) {
      if (ctxt->mode == '\x01') {
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
      }
      eVar2 = (*ctxt->report_error)(ctxt,3,"size parameter required to query stringvector");
      return eVar2;
    }
    if (out == (char **)0x0) {
      uVar6 = (((local_30->field_6).box2i)->min).x;
    }
    else {
      uVar1 = *size;
      peVar3 = (local_30->field_6).chlist;
      uVar6 = peVar3->num_channels;
      if ((int)uVar1 < (int)uVar6) {
        if (ctxt->mode == '\x01') {
          pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
          uVar1 = *size;
          uVar6 = ((local_30->field_6).preview)->width;
        }
        eVar2 = (*ctxt->print_error)
                          (ctxt,3,"\'%s\' array buffer too small (%d) to hold string values (%d)",
                           name,(ulong)uVar1,(ulong)uVar6);
        return eVar2;
      }
      if (0 < (int)uVar6) {
        lVar4 = 8;
        lVar5 = 0;
        do {
          out[lVar5] = *(char **)(peVar3->entries->reserved + lVar4 + -0x15);
          lVar5 = lVar5 + 1;
          peVar3 = (local_30->field_6).chlist;
          uVar6 = peVar3->num_channels;
          lVar4 = lVar4 + 0x10;
        } while (lVar5 < (int)uVar6);
      }
    }
    *size = uVar6;
    eVar2 = 0;
  }
  if (ctxt->mode == '\x01') {
    pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
  }
  return eVar2;
}

Assistant:

exr_result_t
exr_attr_get_string_vector (
    exr_const_context_t ctxt,
    int                 part_index,
    const char*         name,
    int32_t*            size,
    const char**        out)
{
    ATTR_FIND_ATTR (EXR_ATTR_STRING_VECTOR, stringvector);
    if (!size)
        return EXR_UNLOCK_WRITE_AND_RETURN (ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "size parameter required to query stringvector"));
    if (out)
    {
        if (*size < attr->stringvector->n_strings)
            return EXR_UNLOCK_WRITE_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "'%s' array buffer too small (%d) to hold string values (%d)",
                name,
                *size,
                attr->stringvector->n_strings));
        for (int32_t i = 0; i < attr->stringvector->n_strings; ++i)
            out[i] = attr->stringvector->strings[i].str;
    }
    *size = attr->stringvector->n_strings;
    return EXR_UNLOCK_WRITE_AND_RETURN (rv);
}